

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPubkey *ext_pubkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  ExtPubkey *this_01;
  ExtPubkey *in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  ByteData *finterprint_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list_local;
  ExtPubkey *ext_pubkey_local;
  KeyData *this_local;
  
  Pubkey::Pubkey(&this->pubkey_);
  this_01 = (ExtPubkey *)&this->privkey_;
  Privkey::Privkey((Privkey *)this_01);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(in_stack_ffffffffffffffb0,this_01);
  this_00 = &this->path_;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ByteData::ByteData((ByteData *)this_00,&this->fingerprint_);
  ExtPubkey::GetPubkey((Pubkey *)&stack0xffffffffffffffb0,ext_pubkey);
  Pubkey::operator=(&this->pubkey_,(Pubkey *)&stack0xffffffffffffffb0);
  Pubkey::~Pubkey((Pubkey *)0x44ab68);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPubkey& ext_pubkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : extpubkey_(ext_pubkey),
      path_(child_num_list),
      fingerprint_(finterprint) {
  pubkey_ = ext_pubkey.GetPubkey();
}